

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes SkipData(CSzData *sd)

{
  SRes SVar1;
  UInt64 size;
  
  SVar1 = ReadNumber(sd,&size);
  if (SVar1 == 0) {
    if (sd->Size < size) {
      SVar1 = 0x10;
    }
    else {
      sd->Size = sd->Size - size;
      sd->Data = sd->Data + size;
      SVar1 = 0;
    }
  }
  return SVar1;
}

Assistant:

static SRes SkipData(CSzData *sd)
{
  UInt64 size;
  RINOK(ReadNumber(sd, &size));
  if (size > sd->Size)
    return SZ_ERROR_ARCHIVE;
  SKIP_DATA(sd, size);
  return SZ_OK;
}